

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_srcSize(ZSTD_CStream *zcs,int compressionLevel,unsigned_long_long pss)

{
  uint uVar1;
  unsigned_long_long local_58;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U64 pledgedSrcSize;
  unsigned_long_long pss_local;
  int compressionLevel_local;
  ZSTD_CStream *zcs_local;
  
  local_58 = pss;
  if (pss == 0) {
    local_58 = 0xffffffffffffffff;
  }
  zcs_local = (ZSTD_CStream *)ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)zcs_local);
  if (uVar1 == 0) {
    zcs_local = (ZSTD_CStream *)ZSTD_CCtx_refCDict(zcs,(ZSTD_CDict *)0x0);
    uVar1 = ERR_isError((size_t)zcs_local);
    if (uVar1 == 0) {
      zcs_local = (ZSTD_CStream *)
                  ZSTD_CCtx_setParameter(zcs,ZSTD_c_compressionLevel,compressionLevel);
      uVar1 = ERR_isError((size_t)zcs_local);
      if (uVar1 == 0) {
        zcs_local = (ZSTD_CStream *)ZSTD_CCtx_setPledgedSrcSize(zcs,local_58);
        uVar1 = ERR_isError((size_t)zcs_local);
        if (uVar1 == 0) {
          zcs_local = (ZSTD_CStream *)0x0;
        }
      }
    }
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_srcSize(ZSTD_CStream* zcs, int compressionLevel, unsigned long long pss)
{
    /* temporary : 0 interpreted as "unknown" during transition period.
     * Users willing to specify "unknown" **must** use ZSTD_CONTENTSIZE_UNKNOWN.
     * 0 will be interpreted as "empty" in the future.
     */
    U64 const pledgedSrcSize = (pss==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_srcSize");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, NULL) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    return 0;
}